

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall
CVmObjWeakRefLookupTable::remove_stale_undo_weak_ref
          (CVmObjWeakRefLookupTable *this,CVmUndoRecord *undo_rec)

{
  undefined4 *puVar1;
  int iVar2;
  lookuptab_undo_rec *rec;
  
  iVar2 = CVmObjTable::is_obj_deletable(&G_obj_table_X,&undo_rec->oldval);
  if (iVar2 != 0) {
    (undo_rec->oldval).typ = VM_NIL;
  }
  puVar1 = (undefined4 *)(undo_rec->id).ptrval;
  if (puVar1 != (undefined4 *)0x0 && iVar2 != 0) {
    puVar1[2] = 1;
    *puVar1 = 0;
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::
   remove_stale_undo_weak_ref(VMG_ struct CVmUndoRecord *undo_rec)
{
    int forget_record;

    /* presume we won't want to forget the record */
    forget_record = FALSE;

    /* 
     *   if the old value in the undo record refers to an object, forget
     *   about it 
     */
    if (G_obj_table->is_obj_deletable(&undo_rec->oldval))
    {
        /* 
         *   the object is being deleted - since we only weakly reference
         *   our objects, we must forget about this object now; this also
         *   means we can forget about the record entirely, since there is
         *   no need to apply it in the future now that it doesn't do
         *   anything 
         */
        undo_rec->oldval.set_nil();
        forget_record = TRUE;
    }

    /* delete our extended record if we're forgetting the record */
    if (undo_rec->id.ptrval != 0 && forget_record)
    {
        lookuptab_undo_rec *rec;

        /* get our private record from the standard undo record */
        rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;

        /* we don't care about the key value in this record any more */
        rec->key.set_nil();

        /* mark the record as forgotten */
        rec->action = LOOKUPTAB_UNDO_NULL;
    }
}